

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifier.c
# Opt level: O1

int mpt_identifier_compare(mpt_identifier *id,char *name,int nlen)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  
  if ((name != (char *)0x0) && (id->_charset != '\x01')) {
    return -3;
  }
  if (nlen < 0) {
    if (name == (char *)0x0) {
      return -1;
    }
    sVar1 = strlen(name);
    nlen = (int)sVar1;
  }
  if ((nlen != 0) || (id->_len != 0)) {
    if (nlen + 1U != (uint)id->_len) {
      return -0x10;
    }
    if ((ushort)id->_max < id->_len) {
      pcVar3 = id->_base;
    }
    else {
      pcVar3 = id->_val;
    }
    if (name != (char *)0x0) {
      if (0 < nlen) {
        uVar2 = 0;
        do {
          if (pcVar3[uVar2] != name[uVar2]) {
            return (int)uVar2 + 1;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)nlen != uVar2);
      }
      if (pcVar3[nlen] == '\0') {
        return 0;
      }
      return nlen;
    }
    if (-1 < nlen) {
      uVar2 = 0;
      do {
        if (pcVar3[uVar2] != '\0') {
          return (int)uVar2 + 1;
        }
        uVar2 = uVar2 + 1;
      } while (nlen + 1U != uVar2);
      return 0;
    }
  }
  return 0;
}

Assistant:

extern int mpt_identifier_compare(const MPT_STRUCT(identifier) *id, const char *name, int nlen)
{
	const char *base = id->_val;
	int i;
	
	if (name && (id->_charset != MPT_CHARSET(UTF8))) {
		return MPT_ERROR(BadType);
	}
	if (nlen < 0) {
		if (!name) {
			return MPT_ERROR(BadArgument);
		}
		nlen = strlen(name);
	}
	if (!nlen && !id->_len) {
		return 0;
	}
	if ((nlen + 1) != id->_len) {
		return MPT_ERROR(MissingData);
	}
	if (id->_len > id->_max) {
		base = id->_base;
	}
	if (!name) {
		for (i = 0; i <= nlen; ++i) {
			if (base[i]) {
				return i + 1;
			}
		}
		return 0;
	}
	for (i = 0; i < nlen; ++i) {
		if (base[i] != name[i]) {
			return i + 1;
		}
	}
	if (base[nlen]) {
		return nlen;
	}
	return 0;
}